

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void __thiscall WorkQueue<HTTPClosure>::Run(WorkQueue<HTTPClosure> *this)

{
  long lVar1;
  _Elt_pointer puVar2;
  _Elt_pointer puVar3;
  bool bVar4;
  int iVar5;
  _Head_base<0UL,_HTTPClosure_*,_false> _Var6;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&lock.super_unique_lock,&this->cs,"cs",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
               ,0x6d,false);
    while( true ) {
      puVar2 = (this->queue).
               super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      puVar3 = (this->queue).
               super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (this->running != true) break;
      if (puVar3 != puVar2) goto LAB_003c81fe;
      std::condition_variable::wait((unique_lock *)&this->cond);
    }
    if (puVar3 == puVar2) {
      _Var6._M_head_impl = (HTTPClosure *)0x0;
      bVar4 = false;
      iVar5 = 3;
    }
    else {
LAB_003c81fe:
      _Var6._M_head_impl =
           (puVar2->_M_t).super___uniq_ptr_impl<HTTPClosure,_std::default_delete<HTTPClosure>_>._M_t
           .super__Tuple_impl<0UL,_HTTPClosure_*,_std::default_delete<HTTPClosure>_>.
           super__Head_base<0UL,_HTTPClosure_*,_false>._M_head_impl;
      (puVar2->_M_t).super___uniq_ptr_impl<HTTPClosure,_std::default_delete<HTTPClosure>_>._M_t.
      super__Tuple_impl<0UL,_HTTPClosure_*,_std::default_delete<HTTPClosure>_>.
      super__Head_base<0UL,_HTTPClosure_*,_false>._M_head_impl = (HTTPClosure *)0x0;
      std::
      deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
      ::pop_front(&this->queue);
      iVar5 = 0;
      bVar4 = true;
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
    if (bVar4) {
      iVar5 = 0;
      (**(_Var6._M_head_impl)->_vptr_HTTPClosure)(_Var6._M_head_impl);
LAB_003c8235:
      (*(_Var6._M_head_impl)->_vptr_HTTPClosure[2])(_Var6._M_head_impl);
    }
    else if (_Var6._M_head_impl != (HTTPClosure *)0x0) goto LAB_003c8235;
    if (iVar5 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void Run() EXCLUSIVE_LOCKS_REQUIRED(!cs)
    {
        while (true) {
            std::unique_ptr<WorkItem> i;
            {
                WAIT_LOCK(cs, lock);
                while (running && queue.empty())
                    cond.wait(lock);
                if (!running && queue.empty())
                    break;
                i = std::move(queue.front());
                queue.pop_front();
            }
            (*i)();
        }
    }